

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTDMT_compressionJob(void *jobDescription)

{
  undefined4 uVar1;
  ZSTD_window_t window;
  range_t src;
  rawSeqStore_t seqStore;
  rawSeqStore_t seq;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  U32 UVar10;
  uint uVar11;
  ZSTD_CCtx *cctx_00;
  size_t sVar12;
  void *pvVar13;
  ZSTD_matchState_t *pZVar14;
  long *in_RDI;
  buffer_t bVar15;
  size_t cSize_1;
  size_t lastBlockSize;
  size_t lastBlockSize1;
  size_t cSize;
  int chunkNb;
  BYTE *oend;
  BYTE *op;
  BYTE *ostart;
  BYTE *ip;
  int nbChunks;
  size_t chunkSize;
  size_t hSize;
  size_t initError_1;
  size_t err;
  size_t forceWindowError;
  U64 pledgedSrcSize;
  size_t initError;
  size_t lastCBlockSize;
  buffer_t dstBuff;
  rawSeqStore_t rawSeqStore;
  ZSTD_CCtx *cctx;
  ZSTD_CCtx_params jobParams;
  ZSTDMT_jobDescription *job;
  undefined4 uVar16;
  uint in_stack_fffffffffffffdfc;
  undefined1 *puVar17;
  ZSTD_CDict *in_stack_fffffffffffffe00;
  ZSTD_CDict *serialState;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 uVar18;
  undefined4 in_stack_fffffffffffffe14;
  ZSTDMT_CCtxPool *in_stack_fffffffffffffe18;
  ZSTD_CCtx *in_stack_fffffffffffffe20;
  size_t in_stack_fffffffffffffe28;
  uint in_stack_fffffffffffffe30;
  ZSTD_cParameter in_stack_fffffffffffffe34;
  ZSTD_CDict *in_stack_fffffffffffffe38;
  ZSTD_dictTableLoadMethod_e in_stack_fffffffffffffe40;
  ZSTD_dictContentType_e in_stack_fffffffffffffe44;
  ulong in_stack_fffffffffffffe48;
  void *in_stack_fffffffffffffe50;
  ZSTD_CCtx *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  ZSTD_CCtx_params *in_stack_fffffffffffffe70;
  unsigned_long_long in_stack_fffffffffffffe78;
  void *local_138;
  size_t local_130;
  long local_128;
  void *local_120;
  size_t local_118;
  long local_110;
  ZSTD_CDict *pZStack_108;
  void *local_100;
  undefined8 uStack_f8;
  ZSTD_CCtx *local_f0;
  undefined1 local_e0 [36];
  undefined4 local_bc;
  undefined4 local_94;
  int local_80;
  long *local_10;
  
  local_10 = in_RDI;
  memcpy(local_e0,in_RDI + 0x19,0xd0);
  cctx_00 = ZSTDMT_getCCtx(in_stack_fffffffffffffe18);
  ZSTDMT_getSeq((ZSTDMT_seqPool *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  local_120 = (void *)local_10[0x11];
  local_118 = local_10[0x12];
  local_128 = 0;
  uVar18 = (undefined4)uStack_f8;
  uVar9 = (uint)((ulong)uStack_f8 >> 0x20);
  uVar16 = (undefined4)local_110;
  uVar11 = (uint)((ulong)local_110 >> 0x20);
  if (cctx_00 == (ZSTD_CCtx *)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)(local_10 + 2));
    local_10[1] = -0x40;
    pthread_mutex_unlock((pthread_mutex_t *)(local_10 + 2));
    puVar17 = (undefined1 *)((ulong)in_stack_fffffffffffffdfc << 0x20);
    serialState = in_stack_fffffffffffffe00;
  }
  else {
    if (local_120 == (void *)0x0) {
      bVar15 = ZSTDMT_getBuffer((ZSTDMT_bufferPool *)
                                CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      local_138 = bVar15.start;
      local_120 = local_138;
      local_130 = bVar15.capacity;
      local_118 = local_130;
      if (local_138 == (void *)0x0) {
        pthread_mutex_lock((pthread_mutex_t *)(local_10 + 2));
        local_10[1] = -0x40;
        pthread_mutex_unlock((pthread_mutex_t *)(local_10 + 2));
        puVar17 = (undefined1 *)((ulong)in_stack_fffffffffffffdfc << 0x20);
        serialState = in_stack_fffffffffffffe00;
        goto LAB_00391fde;
      }
      local_10[0x11] = (long)local_138;
      local_10[0x12] = local_130;
    }
    if ((local_80 == 1) && (local_110 == 0)) {
      pthread_mutex_lock((pthread_mutex_t *)(local_10 + 2));
      local_10[1] = -0x40;
      pthread_mutex_unlock((pthread_mutex_t *)(local_10 + 2));
      puVar17 = (undefined1 *)((ulong)in_stack_fffffffffffffdfc << 0x20);
      serialState = in_stack_fffffffffffffe00;
    }
    else {
      if ((int)local_10[0x17] != 0) {
        local_bc = 0;
      }
      local_80 = 2;
      local_94 = 0;
      if (local_10[0x33] == 0) {
        if (*(int *)((long)local_10 + 0xbc) == 0) {
          serialState = (ZSTD_CDict *)local_10[0x16];
        }
        else {
          serialState = (ZSTD_CDict *)local_10[0x34];
        }
        in_stack_fffffffffffffe38 = serialState;
        sVar12 = ZSTD_CCtxParams_setParameter
                           ((ZSTD_CCtx_params *)serialState,in_stack_fffffffffffffe34,
                            in_stack_fffffffffffffe30);
        uVar6 = ZSTD_isError(0x39195f);
        if (uVar6 != 0) {
          pthread_mutex_lock((pthread_mutex_t *)(local_10 + 2));
          local_10[1] = sVar12;
          pthread_mutex_unlock((pthread_mutex_t *)(local_10 + 2));
          puVar17 = (undefined1 *)((ulong)in_stack_fffffffffffffdfc << 0x20);
          serialState = in_stack_fffffffffffffe00;
          goto LAB_00391fde;
        }
        if (*(int *)((long)local_10 + 0xbc) == 0) {
          sVar12 = ZSTD_CCtxParams_setParameter
                             ((ZSTD_CCtx_params *)in_stack_fffffffffffffe38,
                              in_stack_fffffffffffffe34,in_stack_fffffffffffffe30);
          uVar6 = ZSTD_isError(0x3919d9);
          if (uVar6 != 0) {
            pthread_mutex_lock((pthread_mutex_t *)(local_10 + 2));
            local_10[1] = sVar12;
            pthread_mutex_unlock((pthread_mutex_t *)(local_10 + 2));
            puVar17 = (undefined1 *)((ulong)in_stack_fffffffffffffdfc << 0x20);
            serialState = in_stack_fffffffffffffe00;
            goto LAB_00391fde;
          }
        }
        puVar17 = local_e0;
        sVar12 = ZSTD_compressBegin_advanced_internal
                           (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                            in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
                            in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                            in_stack_fffffffffffffe70,in_stack_fffffffffffffe78);
        uVar6 = ZSTD_isError(0x391a7f);
        if (uVar6 != 0) {
          pthread_mutex_lock((pthread_mutex_t *)(local_10 + 2));
          local_10[1] = sVar12;
          pthread_mutex_unlock((pthread_mutex_t *)(local_10 + 2));
          goto LAB_00391fde;
        }
      }
      else {
        serialState = (ZSTD_CDict *)local_10[0x34];
        puVar17 = local_e0;
        sVar12 = ZSTD_compressBegin_advanced_internal
                           (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                            in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
                            in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                            in_stack_fffffffffffffe70,in_stack_fffffffffffffe78);
        if (*(int *)((long)local_10 + 0xbc) == 0) {
          __assert_fail("job->firstJob",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x87a3,"void ZSTDMT_compressionJob(void *)");
        }
        uVar6 = ZSTD_isError(0x391892);
        if (uVar6 != 0) {
          pthread_mutex_lock((pthread_mutex_t *)(local_10 + 2));
          local_10[1] = sVar12;
          pthread_mutex_unlock((pthread_mutex_t *)(local_10 + 2));
          goto LAB_00391fde;
        }
      }
      seqStore.seq._4_4_ = in_stack_fffffffffffffe44;
      seqStore.seq._0_4_ = in_stack_fffffffffffffe40;
      seqStore.pos = in_stack_fffffffffffffe48;
      seqStore.posInSequence = (size_t)in_stack_fffffffffffffe50;
      seqStore.size = (size_t)in_stack_fffffffffffffe58;
      seqStore.capacity._0_4_ = in_stack_fffffffffffffe60;
      seqStore.capacity._4_4_ = in_stack_fffffffffffffe64;
      src.size._0_4_ = in_stack_fffffffffffffe30;
      src.start = (void *)in_stack_fffffffffffffe28;
      src.size._4_4_ = in_stack_fffffffffffffe34;
      uVar6 = uVar11;
      serialState = pZStack_108;
      ZSTDMT_serialState_update
                ((serialState_t *)in_stack_fffffffffffffe20,local_f0,seqStore,src,uVar9);
      if (*(int *)((long)local_10 + 0xbc) == 0) {
        sVar12 = ZSTD_compressContinue_public
                           (in_stack_fffffffffffffe20,local_f0,CONCAT44(uVar9,uVar18),local_100,
                            (size_t)serialState);
        uVar7 = ZSTD_isError(0x391b83);
        if (uVar7 != 0) {
          pthread_mutex_lock((pthread_mutex_t *)(local_10 + 2));
          local_10[1] = sVar12;
          pthread_mutex_unlock((pthread_mutex_t *)(local_10 + 2));
          puVar17 = (undefined1 *)((ulong)uVar6 << 0x20);
          goto LAB_00391fde;
        }
        ZSTD_invalidateRepCodes(in_stack_fffffffffffffe20);
      }
      iVar8 = (int)(local_10[0x16] + 0x7ffffU >> 0x13);
      pvVar13 = (void *)((long)local_120 + local_118);
      if (0x3fffffff7ffff < (ulong)local_10[0x16]) {
        __assert_fail("job->src.size < ((size_t)INT_MAX) * chunkSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x87c8,"void ZSTDMT_compressionJob(void *)");
      }
      if (local_10[1] != 0) {
        __assert_fail("job->cSize == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x87ca,"void ZSTDMT_compressionJob(void *)");
      }
      for (in_stack_fffffffffffffe64 = 1; in_stack_fffffffffffffe64 < iVar8;
          in_stack_fffffffffffffe64 = in_stack_fffffffffffffe64 + 1) {
        in_stack_fffffffffffffe58 =
             (ZSTD_CCtx *)
             ZSTD_compressContinue_public
                       (in_stack_fffffffffffffe20,local_f0,CONCAT44(uVar9,uVar18),local_100,
                        (size_t)serialState);
        uVar7 = ZSTD_isError(0x391d03);
        if (uVar7 != 0) {
          pthread_mutex_lock((pthread_mutex_t *)(local_10 + 2));
          local_10[1] = (long)in_stack_fffffffffffffe58;
          pthread_mutex_unlock((pthread_mutex_t *)(local_10 + 2));
          puVar17 = (undefined1 *)((ulong)uVar6 << 0x20);
          goto LAB_00391fde;
        }
        local_120 = (void *)((long)&in_stack_fffffffffffffe58->stage + (long)local_120);
        if (pvVar13 <= local_120) {
          __assert_fail("op < oend",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x87cf,"void ZSTDMT_compressionJob(void *)");
        }
        pthread_mutex_lock((pthread_mutex_t *)(local_10 + 2));
        local_10[1] = (long)&in_stack_fffffffffffffe58->stage + local_10[1];
        *local_10 = (long)in_stack_fffffffffffffe64 << 0x13;
        pthread_cond_signal((pthread_cond_t *)(local_10 + 7));
        pthread_mutex_unlock((pthread_mutex_t *)(local_10 + 2));
      }
      if (0 < iVar8 || (int)local_10[0x18] != 0) {
        in_stack_fffffffffffffe50 = (void *)(local_10[0x16] & 0x7ffff);
        if (in_stack_fffffffffffffe50 == (void *)0x0 && 0x7ffff < (ulong)local_10[0x16]) {
          in_stack_fffffffffffffe30 = 0x80000;
        }
        else {
          in_stack_fffffffffffffe30 = (uint)in_stack_fffffffffffffe50;
        }
        in_stack_fffffffffffffe34 = 0;
        in_stack_fffffffffffffe48 = (ulong)in_stack_fffffffffffffe30;
        if ((int)local_10[0x18] == 0) {
          sVar12 = ZSTD_compressContinue_public
                             (in_stack_fffffffffffffe20,local_f0,CONCAT44(uVar9,uVar18),local_100,
                              (size_t)serialState);
        }
        else {
          sVar12 = ZSTD_compressEnd_public
                             ((ZSTD_CCtx *)in_stack_fffffffffffffe38,
                              (void *)(ulong)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                              in_stack_fffffffffffffe20,(size_t)local_f0);
        }
        in_stack_fffffffffffffe40 = (ZSTD_dictTableLoadMethod_e)sVar12;
        in_stack_fffffffffffffe44 = (ZSTD_dictContentType_e)(sVar12 >> 0x20);
        uVar9 = ZSTD_isError(0x391f19);
        if (uVar9 != 0) {
          pthread_mutex_lock((pthread_mutex_t *)(local_10 + 2));
          local_10[1] = CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40);
          pthread_mutex_unlock((pthread_mutex_t *)(local_10 + 2));
          puVar17 = (undefined1 *)((ulong)uVar6 << 0x20);
          goto LAB_00391fde;
        }
        local_128 = CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40);
      }
      if (*(int *)((long)local_10 + 0xbc) == 0) {
        pZVar14 = &(cctx_00->blockState).matchState;
        serialState = (ZSTD_CDict *)(cctx_00->blockState).matchState.window.base;
        uVar1 = (cctx_00->blockState).matchState.window.lowLimit;
        uVar2 = (pZVar14->window).nextSrc;
        uVar3 = (pZVar14->window).base;
        uVar4 = (pZVar14->window).dictBase;
        uVar5 = (pZVar14->window).dictLimit;
        window.dictLimit = uVar5;
        window.dictBase = (BYTE *)uVar4;
        window.base = (BYTE *)uVar3;
        window.nextSrc = (BYTE *)uVar2;
        uVar6 = (uint)((ulong)(pZVar14->window).nextSrc >> 0x20);
        window.lowLimit = uVar1;
        window.nbOverflowCorrections = (cctx_00->blockState).matchState.window.nbOverflowCorrections
        ;
        window._36_4_ = *(undefined4 *)&(cctx_00->blockState).matchState.window.field_0x24;
        UVar10 = ZSTD_window_hasExtDict(window);
        if (UVar10 != 0) {
          __assert_fail("!ZSTD_window_hasExtDict(cctx->blockState.matchState.window)",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x87e9,"void ZSTDMT_compressionJob(void *)");
        }
      }
      ZSTD_CCtx_trace(cctx_00,0);
      puVar17 = (undefined1 *)((ulong)uVar6 << 0x20);
    }
  }
LAB_00391fde:
  ZSTDMT_serialState_ensureFinished
            ((serialState_t *)serialState,(uint)((ulong)puVar17 >> 0x20),0x39200c);
  seq.seq._4_4_ = in_stack_fffffffffffffe44;
  seq.seq._0_4_ = in_stack_fffffffffffffe40;
  seq.pos = in_stack_fffffffffffffe48;
  seq.posInSequence = (size_t)in_stack_fffffffffffffe50;
  seq.size = (size_t)in_stack_fffffffffffffe58;
  seq.capacity._0_4_ = in_stack_fffffffffffffe60;
  seq.capacity._4_4_ = in_stack_fffffffffffffe64;
  ZSTDMT_releaseSeq((ZSTDMT_seqPool *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                    seq);
  ZSTDMT_releaseCCtx((ZSTDMT_CCtxPool *)pZStack_108,(ZSTD_CCtx *)CONCAT44(uVar11,uVar16));
  pthread_mutex_lock((pthread_mutex_t *)(local_10 + 2));
  uVar11 = ZSTD_isError(0x392092);
  if ((uVar11 != 0) && (local_128 != 0)) {
    __assert_fail("lastCBlockSize == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x87f7,"void ZSTDMT_compressionJob(void *)");
  }
  local_10[1] = local_128 + local_10[1];
  *local_10 = local_10[0x16];
  pthread_cond_signal((pthread_cond_t *)(local_10 + 7));
  pthread_mutex_unlock((pthread_mutex_t *)(local_10 + 2));
  return;
}

Assistant:

static void ZSTDMT_compressionJob(void* jobDescription)
{
    ZSTDMT_jobDescription* const job = (ZSTDMT_jobDescription*)jobDescription;
    ZSTD_CCtx_params jobParams = job->params;   /* do not modify job->params ! copy it, modify the copy */
    ZSTD_CCtx* const cctx = ZSTDMT_getCCtx(job->cctxPool);
    rawSeqStore_t rawSeqStore = ZSTDMT_getSeq(job->seqPool);
    buffer_t dstBuff = job->dstBuff;
    size_t lastCBlockSize = 0;

    /* resources */
    if (cctx==NULL) JOB_ERROR(ERROR(memory_allocation));
    if (dstBuff.start == NULL) {   /* streaming job : doesn't provide a dstBuffer */
        dstBuff = ZSTDMT_getBuffer(job->bufPool);
        if (dstBuff.start==NULL) JOB_ERROR(ERROR(memory_allocation));
        job->dstBuff = dstBuff;   /* this value can be read in ZSTDMT_flush, when it copies the whole job */
    }
    if (jobParams.ldmParams.enableLdm == ZSTD_ps_enable && rawSeqStore.seq == NULL)
        JOB_ERROR(ERROR(memory_allocation));

    /* Don't compute the checksum for chunks, since we compute it externally,
     * but write it in the header.
     */
    if (job->jobID != 0) jobParams.fParams.checksumFlag = 0;
    /* Don't run LDM for the chunks, since we handle it externally */
    jobParams.ldmParams.enableLdm = ZSTD_ps_disable;
    /* Correct nbWorkers to 0. */
    jobParams.nbWorkers = 0;


    /* init */
    if (job->cdict) {
        size_t const initError = ZSTD_compressBegin_advanced_internal(cctx, NULL, 0, ZSTD_dct_auto, ZSTD_dtlm_fast, job->cdict, &jobParams, job->fullFrameSize);
        assert(job->firstJob);  /* only allowed for first job */
        if (ZSTD_isError(initError)) JOB_ERROR(initError);
    } else {  /* srcStart points at reloaded section */
        U64 const pledgedSrcSize = job->firstJob ? job->fullFrameSize : job->src.size;
        {   size_t const forceWindowError = ZSTD_CCtxParams_setParameter(&jobParams, ZSTD_c_forceMaxWindow, !job->firstJob);
            if (ZSTD_isError(forceWindowError)) JOB_ERROR(forceWindowError);
        }
        if (!job->firstJob) {
            size_t const err = ZSTD_CCtxParams_setParameter(&jobParams, ZSTD_c_deterministicRefPrefix, 0);
            if (ZSTD_isError(err)) JOB_ERROR(err);
        }
        {   size_t const initError = ZSTD_compressBegin_advanced_internal(cctx,
                                        job->prefix.start, job->prefix.size, ZSTD_dct_rawContent, /* load dictionary in "content-only" mode (no header analysis) */
                                        ZSTD_dtlm_fast,
                                        NULL, /*cdict*/
                                        &jobParams, pledgedSrcSize);
            if (ZSTD_isError(initError)) JOB_ERROR(initError);
    }   }

    /* Perform serial step as early as possible, but after CCtx initialization */
    ZSTDMT_serialState_update(job->serial, cctx, rawSeqStore, job->src, job->jobID);

    if (!job->firstJob) {  /* flush and overwrite frame header when it's not first job */
        size_t const hSize = ZSTD_compressContinue_public(cctx, dstBuff.start, dstBuff.capacity, job->src.start, 0);
        if (ZSTD_isError(hSize)) JOB_ERROR(hSize);
        DEBUGLOG(5, "ZSTDMT_compressionJob: flush and overwrite %u bytes of frame header (not first job)", (U32)hSize);
        ZSTD_invalidateRepCodes(cctx);
    }

    /* compress */
    {   size_t const chunkSize = 4*ZSTD_BLOCKSIZE_MAX;
        int const nbChunks = (int)((job->src.size + (chunkSize-1)) / chunkSize);
        const BYTE* ip = (const BYTE*) job->src.start;
        BYTE* const ostart = (BYTE*)dstBuff.start;
        BYTE* op = ostart;
        BYTE* oend = op + dstBuff.capacity;
        int chunkNb;
        if (sizeof(size_t) > sizeof(int)) assert(job->src.size < ((size_t)INT_MAX) * chunkSize);   /* check overflow */
        DEBUGLOG(5, "ZSTDMT_compressionJob: compress %u bytes in %i blocks", (U32)job->src.size, nbChunks);
        assert(job->cSize == 0);
        for (chunkNb = 1; chunkNb < nbChunks; chunkNb++) {
            size_t const cSize = ZSTD_compressContinue_public(cctx, op, oend-op, ip, chunkSize);
            if (ZSTD_isError(cSize)) JOB_ERROR(cSize);
            ip += chunkSize;
            op += cSize; assert(op < oend);
            /* stats */
            ZSTD_PTHREAD_MUTEX_LOCK(&job->job_mutex);
            job->cSize += cSize;
            job->consumed = chunkSize * chunkNb;
            DEBUGLOG(5, "ZSTDMT_compressionJob: compress new block : cSize==%u bytes (total: %u)",
                        (U32)cSize, (U32)job->cSize);
            ZSTD_pthread_cond_signal(&job->job_cond);   /* warns some more data is ready to be flushed */
            ZSTD_pthread_mutex_unlock(&job->job_mutex);
        }
        /* last block */
        assert(chunkSize > 0);
        assert((chunkSize & (chunkSize - 1)) == 0);  /* chunkSize must be power of 2 for mask==(chunkSize-1) to work */
        if ((nbChunks > 0) | job->lastJob /*must output a "last block" flag*/ ) {
            size_t const lastBlockSize1 = job->src.size & (chunkSize-1);
            size_t const lastBlockSize = ((lastBlockSize1==0) & (job->src.size>=chunkSize)) ? chunkSize : lastBlockSize1;
            size_t const cSize = (job->lastJob) ?
                 ZSTD_compressEnd_public(cctx, op, oend-op, ip, lastBlockSize) :
                 ZSTD_compressContinue_public(cctx, op, oend-op, ip, lastBlockSize);
            if (ZSTD_isError(cSize)) JOB_ERROR(cSize);
            lastCBlockSize = cSize;
    }   }
    if (!job->firstJob) {
        /* Double check that we don't have an ext-dict, because then our
         * repcode invalidation doesn't work.
         */
        assert(!ZSTD_window_hasExtDict(cctx->blockState.matchState.window));
    }
    ZSTD_CCtx_trace(cctx, 0);

_endJob:
    ZSTDMT_serialState_ensureFinished(job->serial, job->jobID, job->cSize);
    if (job->prefix.size > 0)
        DEBUGLOG(5, "Finished with prefix: %zx", (size_t)job->prefix.start);
    DEBUGLOG(5, "Finished with source: %zx", (size_t)job->src.start);
    /* release resources */
    ZSTDMT_releaseSeq(job->seqPool, rawSeqStore);
    ZSTDMT_releaseCCtx(job->cctxPool, cctx);
    /* report */
    ZSTD_PTHREAD_MUTEX_LOCK(&job->job_mutex);
    if (ZSTD_isError(job->cSize)) assert(lastCBlockSize == 0);
    job->cSize += lastCBlockSize;
    job->consumed = job->src.size;  /* when job->consumed == job->src.size , compression job is presumed completed */
    ZSTD_pthread_cond_signal(&job->job_cond);
    ZSTD_pthread_mutex_unlock(&job->job_mutex);
}